

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.cpp
# Opt level: O0

void ** hash_GetNode(HashMapEntry **map,char *key)

{
  HashType HVar1;
  int iVar2;
  HashMapEntry *local_30;
  HashMapEntry *ptr;
  HashType hashedKey;
  char *key_local;
  HashMapEntry **map_local;
  
  HVar1 = hash(key);
  local_30 = map[HVar1 & 0xffff];
  while( true ) {
    if (local_30 == (HashMapEntry *)0x0) {
      return (void **)0x0;
    }
    if ((HVar1 >> 0x10 == (uint)local_30->hash) && (iVar2 = strcmp(local_30->key,key), iVar2 == 0))
    break;
    local_30 = local_30->next;
  }
  return &local_30->content;
}

Assistant:

void **hash_GetNode(HashMap const map, char const *key)
{
	HashType hashedKey = hash(key);
	struct HashMapEntry *ptr = map[(HalfHashType)hashedKey];

	while (ptr) {
		if (hashedKey >> HALF_HASH_NB_BITS == ptr->hash
		 && !strcmp(ptr->key, key)) {
			return &ptr->content;
		}
		ptr = ptr->next;
	}
	return NULL;
}